

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O0

void h262_print_picparm(h262_picparm *picparm)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  char *local_30;
  char *ps;
  int j;
  int i;
  char *pctstr;
  int b;
  int f;
  h262_picparm *picparm_local;
  
  bVar2 = false;
  bVar3 = false;
  _j = "???";
  printf("Picture header:\n");
  printf("\ttemporal_reference = %d\n",(ulong)picparm->temporal_reference);
  switch(picparm->picture_coding_type) {
  case 1:
    _j = "I";
    break;
  case 2:
    _j = "P";
    bVar2 = true;
    break;
  case 3:
    _j = "B";
    bVar3 = true;
    bVar2 = true;
    break;
  case 4:
    _j = "D";
  }
  printf("\tpicture_coding_type = %d [%s]\n",(ulong)picparm->picture_coding_type,_j);
  printf("\tvbv_delay = %d\n",(ulong)picparm->vbv_delay);
  if (bVar2) {
    printf("\tfull_pel_forward_vector = %d\n",(ulong)picparm->full_pel_forward_vector);
    printf("\tforward_f_code = %d\n",(ulong)picparm->forward_f_code);
  }
  if (bVar3) {
    printf("\tfull_pel_backward_vector = %d\n",(ulong)picparm->full_pel_backward_vector);
    printf("\tbackward_f_code = %d\n",(ulong)picparm->backward_f_code);
  }
  if (picparm->is_ext != 0) {
    for (ps._4_4_ = 0; (int)ps._4_4_ < 2; ps._4_4_ = ps._4_4_ + 1) {
      for (ps._0_4_ = 0; (int)(uint)ps < 2; ps._0_4_ = (uint)ps + 1) {
        printf("\tf_code[%d][%d] = %d\n",(ulong)ps._4_4_,(ulong)(uint)ps,
               (ulong)picparm->f_code[(int)ps._4_4_][(int)(uint)ps]);
      }
    }
    printf("\tintra_dc_precision = %d\n",(ulong)picparm->intra_dc_precision);
    local_30 = "???";
    uVar1 = picparm->picture_structure;
    if (uVar1 == 1) {
      local_30 = "top field";
    }
    else if (uVar1 == 2) {
      local_30 = "bottom field";
    }
    else if (uVar1 == 3) {
      local_30 = "frame";
    }
    printf("\tpicture_structure = %d [%s]\n",(ulong)picparm->picture_structure,local_30);
    printf("\ttop_field_first = %d\n",(ulong)picparm->top_field_first);
    printf("\tframe_pred_frame_dct = %d\n",(ulong)picparm->frame_pred_frame_dct);
    printf("\tconcealment_motion_vectors = %d\n",(ulong)picparm->concealment_motion_vectors);
    printf("\tq_scale_type = %d\n",(ulong)picparm->q_scale_type);
    printf("\tintra_vlc_format = %d\n",(ulong)picparm->intra_vlc_format);
    printf("\talternate_scan = %d\n",(ulong)picparm->alternate_scan);
    printf("\trepeat_first_field = %d\n",(ulong)picparm->repeat_first_field);
    printf("\tchroma_420_type = %d\n",(ulong)picparm->chroma_420_type);
    printf("\tprogressive_frame = %d\n",(ulong)picparm->progressive_frame);
    printf("\tcomposite_display_flag = %d\n",(ulong)picparm->composite_display_flag);
    if (picparm->composite_display_flag != 0) {
      printf("\tv_axis = %d\n",(ulong)picparm->v_axis);
      printf("\tfield_sequence = %d\n",(ulong)picparm->field_sequence);
      printf("\tsub_carrier = %d\n",(ulong)picparm->sub_carrier);
      printf("\tburst_amplitude = %d\n",(ulong)picparm->burst_amplitude);
      printf("\tsub_carrier_phase = %d\n",(ulong)picparm->sub_carrier_phase);
    }
  }
  return;
}

Assistant:

void h262_print_picparm(struct h262_picparm *picparm) {
	int f = 0, b = 0;
	const char *pctstr = "???";
	printf("Picture header:\n");
	printf("\ttemporal_reference = %d\n", picparm->temporal_reference);
	switch (picparm->picture_coding_type) {
		case H262_PIC_TYPE_I:
			pctstr = "I";
			break;
		case H262_PIC_TYPE_P:
			pctstr = "P";
			f = 1;
			break;
		case H262_PIC_TYPE_B:
			pctstr = "B";
			f = b = 1;
			break;
		case H262_PIC_TYPE_D:
			pctstr = "D";
			break;
	}
	printf("\tpicture_coding_type = %d [%s]\n", picparm->picture_coding_type, pctstr);
	printf("\tvbv_delay = %d\n", picparm->vbv_delay);
	if (f) {
		printf("\tfull_pel_forward_vector = %d\n", picparm->full_pel_forward_vector);
		printf("\tforward_f_code = %d\n", picparm->forward_f_code);
	}
	if (b) {
		printf("\tfull_pel_backward_vector = %d\n", picparm->full_pel_backward_vector);
		printf("\tbackward_f_code = %d\n", picparm->backward_f_code);
	}
	if (picparm->is_ext) {
		int i, j;
		for (i = 0; i < 2; i++)
			for (j = 0; j < 2; j++)
				printf("\tf_code[%d][%d] = %d\n", i, j, picparm->f_code[i][j]);
		printf("\tintra_dc_precision = %d\n", picparm->intra_dc_precision);
		const char *ps = "???";
		switch (picparm->picture_structure) {
			case H262_PIC_STRUCT_FIELD_TOP:
				ps = "top field";
				break;
			case H262_PIC_STRUCT_FIELD_BOTTOM:
				ps = "bottom field";
				break;
			case H262_PIC_STRUCT_FRAME:
				ps = "frame";
				break;
		}
		printf("\tpicture_structure = %d [%s]\n", picparm->picture_structure, ps);
		printf("\ttop_field_first = %d\n", picparm->top_field_first);
		printf("\tframe_pred_frame_dct = %d\n", picparm->frame_pred_frame_dct);
		printf("\tconcealment_motion_vectors = %d\n", picparm->concealment_motion_vectors);
		printf("\tq_scale_type = %d\n", picparm->q_scale_type);
		printf("\tintra_vlc_format = %d\n", picparm->intra_vlc_format);
		printf("\talternate_scan = %d\n", picparm->alternate_scan);
		printf("\trepeat_first_field = %d\n", picparm->repeat_first_field);
		printf("\tchroma_420_type = %d\n", picparm->chroma_420_type);
		printf("\tprogressive_frame = %d\n", picparm->progressive_frame);
		printf("\tcomposite_display_flag = %d\n", picparm->composite_display_flag);
		if (picparm->composite_display_flag) {
			printf("\tv_axis = %d\n", picparm->v_axis);
			printf("\tfield_sequence = %d\n", picparm->field_sequence);
			printf("\tsub_carrier = %d\n", picparm->sub_carrier);
			printf("\tburst_amplitude = %d\n", picparm->burst_amplitude);
			printf("\tsub_carrier_phase = %d\n", picparm->sub_carrier_phase);
		}
	}
}